

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O1

Token * __thiscall inja::Lexer::scan_number(Token *__return_storage_ptr__,Lexer *this)

{
  byte bVar1;
  const_pointer pcVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  uVar3 = (this->m_in).size_;
  if (this->m_pos < uVar3) {
    pcVar2 = (this->m_in).data_;
    uVar5 = this->m_pos;
    do {
      uVar4 = uVar5 + 1;
      bVar1 = pcVar2[uVar5];
      if (((int)(char)bVar1 - 0x3aU < 0xfffffff6) &&
         ((uVar6 = bVar1 - 0x2b, 0x3a < uVar6 ||
          ((0x40000000400000dU >> ((ulong)uVar6 & 0x3f) & 1) == 0)))) break;
      this->m_pos = uVar4;
      uVar5 = uVar4;
    } while (uVar4 != uVar3);
  }
  local_18.data_ = (this->m_in).data_;
  local_18.size_ = (this->m_in).size_;
  uVar3 = this->m_tok_start;
  if (local_18.size_ < this->m_tok_start) {
    uVar3 = local_18.size_;
  }
  uVar5 = this->m_pos;
  if (this->m_pos < uVar3) {
    uVar5 = uVar3;
  }
  if (local_18.size_ <= uVar5) {
    uVar5 = local_18.size_;
  }
  bVar7 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                    (&local_18,uVar3,uVar5 - uVar3);
  __return_storage_ptr__->kind = Number;
  (__return_storage_ptr__->text).data_ = bVar7.data_;
  (__return_storage_ptr__->text).size_ = bVar7.size_;
  return __return_storage_ptr__;
}

Assistant:

Token scan_number() {
		for (;;) {
			if (m_pos >= m_in.size()) {
				break;
			}
			char ch = m_in[m_pos];
			// be very permissive in lexer (we'll catch errors when conversion happens)
			if (!std::isdigit(ch) && ch != '.' && ch != 'e' && ch != 'E' && ch != '+' && ch != '-') {
				break;
			}
			m_pos += 1;
		}
		return make_token(Token::Kind::Number);
	}